

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
getShaderInitialization_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType)

{
  bool bVar1;
  ContextType ctxType;
  string *psVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ostringstream source;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  iVar4 = (int)ctx;
  if (bVar1) {
    uVar5 = iVar4 - 2;
    if (2 < uVar5) goto LAB_01613e7b;
    pcVar6 = &DAT_01c83cc0 + *(int *)(&DAT_01c83cc0 + (ulong)uVar5 * 4);
    lVar3 = *(long *)(&DAT_01c83cd0 + (ulong)uVar5 * 8);
  }
  else if (iVar4 == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"#extension GL_EXT_geometry_shader : enable\n",0x2b);
    lVar3 = 0x1e;
    pcVar6 = "layout(max_vertices = 5) out;\n";
  }
  else if (iVar4 == 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"#extension GL_EXT_tessellation_shader : enable\n",0x2f);
    lVar3 = 0x1a;
    pcVar6 = "layout(vertices = 3) out;\n";
  }
  else {
    if (iVar4 != 4) goto LAB_01613e7b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"#extension GL_EXT_tessellation_shader : enable\n",0x2f);
    lVar3 = 0x29;
    pcVar6 = "layout(triangles, equal_spacing, cw) in;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar6,lVar3);
LAB_01613e7b:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return psVar2;
}

Assistant:

std::string getShaderInitialization (NegativeTestContext& ctx, glu::ShaderType shaderType)
{
	std::ostringstream source;

	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		switch (shaderType)
		{
			case glu::SHADERTYPE_GEOMETRY:
				source << "#extension GL_EXT_geometry_shader : enable\n";
				break;

			case glu::SHADERTYPE_TESSELLATION_CONTROL:
				source << "#extension GL_EXT_tessellation_shader : enable\n";
				break;

			case glu::SHADERTYPE_TESSELLATION_EVALUATION:
				source << "#extension GL_EXT_tessellation_shader : enable\n";
				break;

			default:
				break;
		}
	}

	switch (shaderType)
	{
		case glu::SHADERTYPE_GEOMETRY:
			source << "layout(max_vertices = 5) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			source << "layout(vertices = 3) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			source << "layout(triangles, equal_spacing, cw) in;\n";
			break;

		default:
			break;
	}

	return source.str();
}